

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

ON_DimStyle * __thiscall ON_BinaryArchive::Internal_ArchiveCurrentDimStyle(ON_BinaryArchive *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  archive_mode aVar6;
  ON_UUID *b;
  ON_DimStyle **ppOVar7;
  ON_DimStyle *pOVar8;
  ON_DimStyle *local_98;
  ON_DimStyle *current_ds;
  ON_DimStyle *system_ds;
  ON_DimStyle *archive_dim_style_2;
  ON_DimStyle *pOStack_78;
  uint i_2;
  double s;
  ON_DimStyle *pOStack_68;
  LengthUnitSystem ds_unit_system;
  ON_DimStyle *archive_dim_style_1;
  ON_DimStyle *pOStack_58;
  uint i_1;
  ON_DimStyle *unit_scale_ds;
  ON_DimStyle *inch_mm_ds;
  double unit_scale;
  ON_DimStyle *pOStack_38;
  int index;
  ON_DimStyle *archive_dim_style;
  uint i;
  ON_UUID id;
  LengthUnitSystem model_unit_system;
  ON_BinaryArchive *this_local;
  
  id.Data4[3] = 0xff;
  unique0x10000421 = this;
  if (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0) {
    id.Data4[3] = ON_UnitSystem::UnitSystem
                            (&(this->m_archive_3dm_settings->m_ModelUnitsAndTolerances).
                              m_unit_system);
    join_0x00000010_0x00000000_ =
         ON_3dmSettings::CurrentDimensionStyleId(this->m_archive_3dm_settings);
    bVar2 = ::operator!=(&ON_nil_uuid,(ON_UUID_struct *)((long)&archive_dim_style + 4));
    if (bVar2) {
      for (archive_dim_style._0_4_ = 0; uVar1 = (uint)archive_dim_style,
          uVar5 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table),
          uVar1 < uVar5; archive_dim_style._0_4_ = (uint)archive_dim_style + 1) {
        ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                            (&this->m_archive_dim_style_table,(uint)archive_dim_style);
        pOStack_38 = *ppOVar7;
        bVar2 = ON_ModelComponent::ParentIdIsNotNil(&pOStack_38->super_ON_ModelComponent);
        if (!bVar2) {
          b = ON_ModelComponent::Id(&pOStack_38->super_ON_ModelComponent);
          bVar2 = ::operator==((ON_UUID_struct *)((long)&archive_dim_style + 4),b);
          if (bVar2) {
            return pOStack_38;
          }
        }
      }
    }
    iVar3 = ON_3dmSettings::CurrentDimensionStyleIndex(this->m_archive_3dm_settings);
    unit_scale._4_4_ = iVar3;
    if (((-1 < iVar3) &&
        (iVar4 = ON_SimpleArray<ON_DimStyle_*>::Count(&this->m_archive_dim_style_table),
        iVar3 < iVar4)) &&
       (ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                            (&this->m_archive_dim_style_table,unit_scale._4_4_),
       *ppOVar7 != (ON_DimStyle *)0x0)) {
      ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                          (&this->m_archive_dim_style_table,unit_scale._4_4_);
      bVar2 = ON_ModelComponent::ParentIdIsNotNil(&(*ppOVar7)->super_ON_ModelComponent);
      if (bVar2) {
        ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                            (&this->m_archive_dim_style_table,unit_scale._4_4_);
        return *ppOVar7;
      }
    }
    bVar2 = ON::IsTerrestrialLengthUnit(id.Data4[3]);
    if (bVar2) {
      inch_mm_ds = (ON_DimStyle *)0x7e37e43c8800759c;
      unit_scale_ds = (ON_DimStyle *)0x0;
      pOStack_58 = (ON_DimStyle *)0x0;
      for (archive_dim_style_1._4_4_ = 0; uVar1 = archive_dim_style_1._4_4_,
          uVar5 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table),
          uVar1 < uVar5; archive_dim_style_1._4_4_ = archive_dim_style_1._4_4_ + 1) {
        ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                            (&this->m_archive_dim_style_table,archive_dim_style_1._4_4_);
        pOStack_68 = *ppOVar7;
        bVar2 = ON_ModelComponent::ParentIdIsNotNil(&pOStack_68->super_ON_ModelComponent);
        if ((!bVar2) && (bVar2 = ON_DimStyle::UnitSystemIsSet(pOStack_68), bVar2)) {
          s._7_1_ = ON_DimStyle::UnitSystem(pOStack_68);
          if (s._7_1_ == id.Data4[3]) {
            return pOStack_68;
          }
          if (this->m_archive_current_dim_style == (ON_DimStyle *)0x0) {
            bVar2 = ON::IsUnitedStatesCustomaryLengthUnit(id.Data4[3]);
            if ((bVar2) && (s._7_1_ == Inches)) {
              unit_scale_ds = pOStack_68;
            }
            else {
              bVar2 = ON::IsMetricLengthUnit(id.Data4[3]);
              if ((bVar2) && (s._7_1_ == Millimeters)) {
                unit_scale_ds = pOStack_68;
              }
            }
          }
          pOStack_78 = (ON_DimStyle *)ON::UnitScale(id.Data4[3],s._7_1_);
          if ((double)pOStack_78 < 1.0) {
            pOStack_78 = (ON_DimStyle *)ON::UnitScale(s._7_1_,id.Data4[3]);
          }
          if ((1.0 < (double)pOStack_78) && ((double)pOStack_78 < (double)inch_mm_ds)) {
            pOStack_58 = pOStack_68;
            inch_mm_ds = pOStack_78;
          }
        }
      }
      if (unit_scale_ds != (ON_DimStyle *)0x0) {
        return unit_scale_ds;
      }
      if (pOStack_58 != (ON_DimStyle *)0x0) {
        return pOStack_58;
      }
    }
  }
  archive_dim_style_2._4_4_ = 0;
  while( true ) {
    uVar1 = archive_dim_style_2._4_4_;
    uVar5 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table);
    if (uVar5 <= uVar1) {
      bVar2 = ON::IsUnitedStatesCustomaryLengthUnit(id.Data4[3]);
      if (bVar2) {
        current_ds = &ON_DimStyle::DefaultInchDecimal;
      }
      else {
        bVar2 = ON::IsMetricLengthUnit(id.Data4[3]);
        if (bVar2) {
          current_ds = &ON_DimStyle::DefaultMillimeterSmall;
        }
        else {
          current_ds = &ON_DimStyle::Default;
        }
      }
      pOVar8 = (ON_DimStyle *)operator_new(0x450);
      ON_DimStyle::ON_DimStyle(pOVar8,current_ds);
      local_98 = pOVar8;
      ON_ModelComponent::SetId((ON_ModelComponent *)pOVar8);
      pOVar8 = local_98;
      iVar3 = ON_SimpleArray<ON_DimStyle_*>::Count(&this->m_archive_dim_style_table);
      ON_ModelComponent::SetIndex(&pOVar8->super_ON_ModelComponent,iVar3);
      aVar6 = Mode(this);
      if (aVar6 == read3dm) {
        Internal_Read3dmUpdateManifest(this,&local_98->super_ON_ModelComponent);
      }
      else {
        ON_ComponentManifest::AddComponentToManifest
                  (&this->m_manifest,&local_98->super_ON_ModelComponent,true,(ON_wString *)0x0);
      }
      ON_SimpleArray<ON_DimStyle_*>::Append(&this->m_archive_dim_style_table,&local_98);
      return local_98;
    }
    ppOVar7 = ON_SimpleArray<ON_DimStyle_*>::operator[]
                        (&this->m_archive_dim_style_table,archive_dim_style_2._4_4_);
    system_ds = *ppOVar7;
    bVar2 = ON_ModelComponent::ParentIdIsNotNil(&system_ds->super_ON_ModelComponent);
    if ((!bVar2) && (bVar2 = ON_DimStyle::UnitSystemIsSet(system_ds), bVar2)) break;
    archive_dim_style_2._4_4_ = archive_dim_style_2._4_4_ + 1;
  }
  return system_ds;
}

Assistant:

const ON_DimStyle* ON_BinaryArchive::Internal_ArchiveCurrentDimStyle()
{
  ON::LengthUnitSystem model_unit_system = ON::LengthUnitSystem::Unset;
  if (nullptr != m_archive_3dm_settings)
  {
    model_unit_system = m_archive_3dm_settings->m_ModelUnitsAndTolerances.m_unit_system.UnitSystem();
    const ON_UUID id = m_archive_3dm_settings->CurrentDimensionStyleId();
    if (ON_nil_uuid != id)
    {
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if ( id == archive_dim_style->Id())
        {
          return archive_dim_style;
          break;
        }
      }
    }

    const int index = m_archive_3dm_settings->CurrentDimensionStyleIndex();
    if (index >= 0 && index < m_archive_dim_style_table.Count() && nullptr != m_archive_dim_style_table[index] && m_archive_dim_style_table[index]->ParentIdIsNotNil() )
      return m_archive_dim_style_table[index];

    if (ON::IsTerrestrialLengthUnit(model_unit_system))
    {
      double unit_scale = 1e300;
      const ON_DimStyle* inch_mm_ds = nullptr;
      const ON_DimStyle* unit_scale_ds = nullptr;
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if (false == archive_dim_style->UnitSystemIsSet())
          continue;

        const ON::LengthUnitSystem ds_unit_system = archive_dim_style->UnitSystem();
        if (ds_unit_system == model_unit_system)
          return archive_dim_style;

        if (nullptr == m_archive_current_dim_style)
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system) && ON::LengthUnitSystem::Inches == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
          else if (ON::IsMetricLengthUnit(model_unit_system) && ON::LengthUnitSystem::Millimeters == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
        }

        double s = ON::UnitScale(model_unit_system, ds_unit_system);
        if (s < 1.0)
          s = ON::UnitScale(ds_unit_system, model_unit_system);
        if (s > 1.0 && s < unit_scale)
        {
          unit_scale_ds = archive_dim_style;
          unit_scale = s;
        }
      }
      if (nullptr != inch_mm_ds)
        return inch_mm_ds;
      if (nullptr != unit_scale_ds)
        return unit_scale_ds;
    }
  }

  for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
  {
    const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (archive_dim_style->ParentIdIsNotNil())
      continue;
    if (false == archive_dim_style->UnitSystemIsSet())
      continue;
    return archive_dim_style;
  }
  
  const ON_DimStyle* system_ds;
  if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultInchDecimal;  
  else if (ON::IsMetricLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultMillimeterSmall;
  else
    system_ds = &ON_DimStyle::Default;

  // invent a current dimstyle. Happens when reading files written by Rhino 1.1.
  ON_DimStyle* current_ds = new ON_DimStyle(*system_ds);
  current_ds->SetId();
  current_ds->SetIndex(m_archive_dim_style_table.Count());
  if ( ON::archive_mode::read3dm == Mode())
    Internal_Read3dmUpdateManifest(*current_ds);
  else
    m_manifest.AddComponentToManifest(*current_ds, true, nullptr);

  m_archive_dim_style_table.Append(current_ds);

  return current_ds;
}